

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

bool string_empty_value::is_empty_value(string *v)

{
  bool bVar1;
  
  if (v->_M_string_length == 2) {
    bVar1 = *(short *)(v->_M_dataplus)._M_p == 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool is_empty_value(const std::string& v) { return v == std::string("\0\0", 2); }